

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Cord __thiscall
absl::lts_20250127::Cord::ChunkIterator::AdvanceAndReadBytes(ChunkIterator *this,size_t n)

{
  Nonnull<char_*> __dest;
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  CordRep *pCVar4;
  Nullable<CordRep_*> pCVar5;
  CordRepSubstring *pCVar6;
  CordRepExternal *pCVar7;
  CordRepFlat *this_00;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar8;
  string_view sVar9;
  Cord CVar10;
  char *local_198;
  CordRep *local_180;
  CordRep *tree;
  size_t offset;
  char *data;
  CordRep *payload;
  CordRep *tree_1;
  char *pcStack_98;
  string_view local_90;
  Nonnull<CordRep_*> local_80;
  CordRep *rep;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  Cord local_58;
  size_type local_48;
  size_t chunk_size;
  Nonnull<char_*> local_30;
  char *data_1;
  MethodIdentifier method;
  size_t n_local;
  ChunkIterator *this_local;
  Cord *subcord;
  
  _method = in_RDX;
  n_local = n;
  this_local = this;
  if (*(ulong *)(n + 0x18) < in_RDX) {
    AdvanceAndReadBytes::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&data_1 + 7));
  }
  data_1._6_1_ = 0;
  Cord((Cord *)this);
  data_1._0_4_ = 10;
  if (_method < 0x10) {
    local_30 = InlineRep::set_data((InlineRep *)this,_method);
    while (uVar8 = _method,
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)n),
          __dest = local_30, sVar2 < uVar8) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)n);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)n);
      memcpy(__dest,pvVar3,sVar2);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)n);
      local_30 = local_30 + sVar2;
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)n);
      _method = _method - sVar2;
      operator++((ChunkIterator *)n);
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)n);
    memcpy(__dest,pvVar3,_method);
    uVar8 = _method;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)n);
    if (uVar8 < sVar2) {
      RemoveChunkPrefix((ChunkIterator *)n,_method);
      uVar8 = extraout_RDX_00;
    }
    else {
      uVar8 = extraout_RDX;
      if (_method != 0) {
        operator++((ChunkIterator *)n);
        uVar8 = extraout_RDX_01;
      }
    }
  }
  else {
    bVar1 = cord_internal::CordRepBtreeReader::operator_cast_to_bool
                      ((CordRepBtreeReader *)(n + 0x20));
    if (bVar1) {
      local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)n);
      if ((local_48 < _method) || (0x1ff < _method)) {
        local_90 = cord_internal::CordRepBtreeReader::Read
                             ((CordRepBtreeReader *)(n + 0x20),_method,local_48,&local_80);
        *(string_view *)n = local_90;
        InlineRep::EmplaceTree((InlineRep *)this,local_80,kCordReader);
      }
      else {
        local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)n,0,_method);
        Cord(&local_58,local_68,kCordReader);
        Cord::operator=((Cord *)this,&local_58);
        ~Cord(&local_58);
        if (_method < local_48) {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)n,_method);
        }
        else {
          sVar9 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
          *(string_view *)n = sVar9;
        }
      }
      *(ulong *)(n + 0x18) = *(long *)(n + 0x18) - _method;
      uVar8 = _method;
    }
    else {
      if (*(long *)(n + 0x10) == 0) {
        __assert_fail("current_leaf_ != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                      ,0x46a,"Cord absl::Cord::ChunkIterator::AdvanceAndReadBytes(size_t)");
      }
      if (_method == **(ulong **)(n + 0x10)) {
        *(undefined8 *)(n + 0x18) = 0;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&tree_1);
        *(CordRep **)n = tree_1;
        *(char **)(n + 8) = pcStack_98;
        pCVar4 = cord_internal::CordRep::Ref(*(CordRep **)(n + 0x10));
        pCVar5 = VerifyTree(pCVar4);
        InlineRep::EmplaceTree((InlineRep *)this,pCVar5,kCordReader);
        uVar8 = extraout_RDX_02;
      }
      else {
        bVar1 = cord_internal::CordRep::IsSubstring(*(CordRep **)(n + 0x10));
        if (bVar1) {
          pCVar6 = cord_internal::CordRep::substring(*(CordRep **)(n + 0x10));
          local_180 = pCVar6->child;
        }
        else {
          local_180 = *(CordRep **)(n + 0x10);
        }
        bVar1 = cord_internal::CordRep::IsExternal(local_180);
        if (bVar1) {
          pCVar7 = cord_internal::CordRep::external(local_180);
          local_198 = pCVar7->base;
        }
        else {
          this_00 = cord_internal::CordRep::flat(local_180);
          local_198 = cord_internal::CordRepFlat::Data(this_00);
        }
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)n);
        pCVar4 = cord_internal::CordRepSubstring::Substring
                           (local_180,(long)pvVar3 - (long)local_198,_method);
        pCVar5 = VerifyTree(pCVar4);
        InlineRep::EmplaceTree((InlineRep *)this,pCVar5,kCordReader);
        *(ulong *)(n + 0x18) = *(long *)(n + 0x18) - _method;
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)n,_method);
        uVar8 = extraout_RDX_03;
      }
    }
  }
  CVar10.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar8;
  CVar10.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar10.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::ChunkIterator::AdvanceAndReadBytes(size_t n) {
  ABSL_HARDENING_ASSERT(bytes_remaining_ >= n &&
                        "Attempted to iterate past `end()`");
  Cord subcord;
  auto constexpr method = CordzUpdateTracker::kCordReader;

  if (n <= InlineRep::kMaxInline) {
    // Range to read fits in inline data. Flatten it.
    char* data = subcord.contents_.set_data(n);
    while (n > current_chunk_.size()) {
      memcpy(data, current_chunk_.data(), current_chunk_.size());
      data += current_chunk_.size();
      n -= current_chunk_.size();
      ++*this;
    }
    memcpy(data, current_chunk_.data(), n);
    if (n < current_chunk_.size()) {
      RemoveChunkPrefix(n);
    } else if (n > 0) {
      ++*this;
    }
    return subcord;
  }

  if (btree_reader_) {
    size_t chunk_size = current_chunk_.size();
    if (n <= chunk_size && n <= kMaxBytesToCopy) {
      subcord = Cord(current_chunk_.substr(0, n), method);
      if (n < chunk_size) {
        current_chunk_.remove_prefix(n);
      } else {
        current_chunk_ = btree_reader_.Next();
      }
    } else {
      CordRep* rep;
      current_chunk_ = btree_reader_.Read(n, chunk_size, rep);
      subcord.contents_.EmplaceTree(rep, method);
    }
    bytes_remaining_ -= n;
    return subcord;
  }

  // Short circuit if reading the entire data edge.
  assert(current_leaf_ != nullptr);
  if (n == current_leaf_->length) {
    bytes_remaining_ = 0;
    current_chunk_ = {};
    CordRep* tree = CordRep::Ref(current_leaf_);
    subcord.contents_.EmplaceTree(VerifyTree(tree), method);
    return subcord;
  }

  // From this point on, we need a partial substring node.
  // Get pointer to the underlying flat or external data payload and
  // compute data pointer and offset into current flat or external.
  CordRep* payload = current_leaf_->IsSubstring()
                         ? current_leaf_->substring()->child
                         : current_leaf_;
  const char* data = payload->IsExternal() ? payload->external()->base
                                           : payload->flat()->Data();
  const size_t offset = static_cast<size_t>(current_chunk_.data() - data);

  auto* tree = CordRepSubstring::Substring(payload, offset, n);
  subcord.contents_.EmplaceTree(VerifyTree(tree), method);
  bytes_remaining_ -= n;
  current_chunk_.remove_prefix(n);
  return subcord;
}